

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

char * soplex::
       getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                 (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *lp,int idx,NameSet *cnames,char *buf)

{
  bool bVar1;
  DataKey this;
  char *pcVar2;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RCX;
  long in_RDX;
  uint in_ESI;
  DataKey key;
  undefined8 in_stack_ffffffffffffffd0;
  DataKey this_00;
  
  if (in_RDX != 0) {
    this = (DataKey)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::cId(in_RCX,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    this_00 = this;
    bVar1 = NameSet::has((NameSet *)this,(DataKey *)this);
    if (bVar1) {
      pcVar2 = NameSet::operator[]((NameSet *)this_00,(DataKey *)this);
      return pcVar2;
    }
  }
  spxSnprintf((char *)in_RCX,0x10,"x%d",(ulong)in_ESI);
  return (char *)in_RCX;
}

Assistant:

static const char* getColName(
   const SPxLPBase<R>*   lp,
   int            idx,
   const NameSet* cnames,
   char*          buf)
{
   assert(buf != nullptr);
   assert(idx >= 0);
   assert(idx < lp->nCols());

   if(cnames != nullptr)
   {
      DataKey key = lp->cId(idx);

      if(cnames->has(key))
         return (*cnames)[key];
   }

   spxSnprintf(buf, 16, "x%d", idx);

   return buf;
}